

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

SegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *this,size_t pageCount)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t sVar5;
  char *pcVar6;
  HANDLE pVVar7;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  size_t pageCount_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  if ((this->isClosed & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x4a6,"(!isClosed)","!isClosed");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = ValidThreadAccess(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x4a7,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->isUsed = true;
  this_local = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                *)DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
                  PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,unsigned_long,bool>
                            ((DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
                              *)&this->largeSegments,
                             (NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,this,pageCount,
                             (bool)(this->enableWriteBarrier & 1));
  if (this_local ==
      (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
       *)0x0) {
    this_local = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *)0x0;
  }
  else {
    bVar3 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::Initialize
                      ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local,
                       this->allocFlags | 0x1000,(bool)(this->excludeGuardPages & 1));
    if (bVar3) {
      LogAllocSegment(this,(SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local);
      sVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetPageCount
                        ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local);
      LogAllocPages(this,sVar5);
      pcVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                         ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local);
      sVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetPageCount
                        ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local);
      PageTracking::ReportAllocation((PageAllocator *)this,pcVar6,sVar5 << 0xc);
      if ((this->verifyEnabled & 1U) != 0) {
        pVVar1 = this->processHandle;
        pVVar7 = GetCurrentProcess();
        if (pVVar1 != pVVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x4c0,"(this->processHandle == GetCurrentProcess())",
                             "this->processHandle == GetCurrentProcess()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pcVar6 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                           ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local);
        sVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetPageCount
                          ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local);
        memset(pcVar6,0xca,sVar5 << 0xc);
      }
    }
    else {
      DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      RemoveHead<Memory::NoThrowHeapAllocator>
                (&this->largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
      this_local = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    *)0x0;
    }
  }
  return (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local;
}

Assistant:

TSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocSegment(size_t pageCount)
{
    Assert(!isClosed);
    ASSERT_THREAD();

    // Even though we don't idle decommit large segments, we still need to consider these allocations
    // as using the page allocator
    this->isUsed = true;

    TSegment * segment = largeSegments.PrependNode(&NoThrowNoMemProtectHeapAllocator::Instance,
        this, pageCount, enableWriteBarrier);
    if (segment == nullptr)
    {
        return nullptr;
    }
    if (!segment->Initialize(MEM_COMMIT | allocFlags, excludeGuardPages))
    {
        largeSegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
        return nullptr;
    }

    LogAllocSegment(segment);
    LogAllocPages(segment->GetPageCount());

    PageTracking::ReportAllocation((PageAllocator*)this, segment->GetAddress(), AutoSystemInfo::PageSize * segment->GetPageCount());
#ifdef RECYCLER_MEMORY_VERIFY
    if (verifyEnabled)
    {
        Assert(this->processHandle == GetCurrentProcess());
        memset(segment->GetAddress(), Recycler::VerifyMemFill, AutoSystemInfo::PageSize * segment->GetPageCount());
    }
#endif

    return segment;
}